

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldParserHelper::ParseLengthDelimited
          (UnknownFieldParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  uint32_t size_00;
  string *s_00;
  int size;
  string *s;
  ParseContext *ctx_local;
  char *ptr_local;
  UnknownFieldParserHelper *pUStack_18;
  uint32_t num_local;
  UnknownFieldParserHelper *this_local;
  
  ctx_local = (ParseContext *)ptr;
  ptr_local._4_4_ = num;
  pUStack_18 = this;
  s_00 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(this->unknown_,num);
  size_00 = ReadSize((char **)&ctx_local);
  if (ctx_local == (ParseContext *)0x0) {
    this_local = (UnknownFieldParserHelper *)0x0;
  }
  else {
    this_local = (UnknownFieldParserHelper *)
                 EpsCopyInputStream::ReadString
                           (&ctx->super_EpsCopyInputStream,(char *)ctx_local,size_00,s_00);
  }
  return (char *)this_local;
}

Assistant:

const char* ParseLengthDelimited(uint32_t num, const char* ptr,
                                   ParseContext* ctx) {
    std::string* s = unknown_->AddLengthDelimited(num);
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    return ctx->ReadString(ptr, size, s);
  }